

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_make_listen_socket_reuseable(int sock)

{
  int iVar1;
  undefined4 local_10;
  int local_c;
  int one;
  int sock_local;
  
  local_10 = 1;
  local_c = sock;
  iVar1 = setsockopt(sock,1,2,&local_10,4);
  return iVar1;
}

Assistant:

int
evutil_make_listen_socket_reuseable(evutil_socket_t sock)
{
#if defined(SO_REUSEADDR) && !defined(_WIN32)
	int one = 1;
	/* REUSEADDR on Unix means, "don't hang on to this address after the
	 * listener is closed."  On Windows, though, it means "don't keep other
	 * processes from binding to this address while we're using it. */
	return setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (void*) &one,
	    (ev_socklen_t)sizeof(one));
#else
	return 0;
#endif
}